

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O0

void Io_WriteVerilogInt(FILE *pFile,Abc_Ntk_t *pNtk,int fOnlyAnds)

{
  int iVar1;
  char *pcVar2;
  int fOnlyAnds_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  pcVar2 = Abc_NtkName(pNtk);
  pcVar2 = Io_WriteVerilogGetName(pcVar2);
  fprintf((FILE *)pFile,"module %s ( ",pcVar2);
  iVar1 = Abc_NtkLatchNum(pNtk);
  if ((0 < iVar1) && (iVar1 = Nm_ManFindIdByName(pNtk->pManName,"clock",2), iVar1 == -1)) {
    fprintf((FILE *)pFile,"clock, ");
  }
  fprintf((FILE *)pFile,"\n   ");
  iVar1 = Abc_NtkPiNum(pNtk);
  if (0 < iVar1) {
    Io_WriteVerilogPis(pFile,pNtk,3);
    fprintf((FILE *)pFile,",\n   ");
  }
  iVar1 = Abc_NtkPoNum(pNtk);
  if (0 < iVar1) {
    Io_WriteVerilogPos(pFile,pNtk,3);
  }
  fprintf((FILE *)pFile,"  );\n");
  iVar1 = Abc_NtkLatchNum(pNtk);
  if ((0 < iVar1) && (iVar1 = Nm_ManFindIdByName(pNtk->pManName,"clock",2), iVar1 == -1)) {
    fprintf((FILE *)pFile,"  input  clock;\n");
  }
  iVar1 = Abc_NtkPiNum(pNtk);
  if (0 < iVar1) {
    fprintf((FILE *)pFile,"  input ");
    Io_WriteVerilogPis(pFile,pNtk,10);
    fprintf((FILE *)pFile,";\n");
  }
  iVar1 = Abc_NtkPoNum(pNtk);
  if (0 < iVar1) {
    fprintf((FILE *)pFile,"  output");
    Io_WriteVerilogPos(pFile,pNtk,5);
    fprintf((FILE *)pFile,";\n");
  }
  iVar1 = Abc_NtkHasBlackbox(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkLatchNum(pNtk);
    if (0 < iVar1) {
      fprintf((FILE *)pFile,"  reg");
      Io_WriteVerilogRegs(pFile,pNtk,4);
      fprintf((FILE *)pFile,";\n");
    }
    iVar1 = Io_WriteVerilogWiresCount(pNtk);
    if (0 < iVar1) {
      fprintf((FILE *)pFile,"  wire");
      Io_WriteVerilogWires(pFile,pNtk,4);
      fprintf((FILE *)pFile,";\n");
    }
    Io_WriteVerilogObjects(pFile,pNtk,fOnlyAnds);
    iVar1 = Abc_NtkLatchNum(pNtk);
    if (0 < iVar1) {
      Io_WriteVerilogLatches(pFile,pNtk);
    }
  }
  fprintf((FILE *)pFile,"endmodule\n\n");
  return;
}

Assistant:

void Io_WriteVerilogInt( FILE * pFile, Abc_Ntk_t * pNtk, int fOnlyAnds )
{
    // write inputs and outputs
//    fprintf( pFile, "module %s ( gclk,\n   ", Abc_NtkName(pNtk) );
    fprintf( pFile, "module %s ( ", Io_WriteVerilogGetName(Abc_NtkName(pNtk)) );
    // add the clock signal if it does not exist
    if ( Abc_NtkLatchNum(pNtk) > 0 && Nm_ManFindIdByName(pNtk->pManName, "clock", ABC_OBJ_PI) == -1 )
        fprintf( pFile, "clock, " );
    // write other primary inputs
    fprintf( pFile, "\n   " );
    if ( Abc_NtkPiNum(pNtk) > 0  )
    {
        Io_WriteVerilogPis( pFile, pNtk, 3 );
        fprintf( pFile, ",\n   " );
    }
    if ( Abc_NtkPoNum(pNtk) > 0  )
        Io_WriteVerilogPos( pFile, pNtk, 3 );
    fprintf( pFile, "  );\n" );
    // add the clock signal if it does not exist
    if ( Abc_NtkLatchNum(pNtk) > 0 && Nm_ManFindIdByName(pNtk->pManName, "clock", ABC_OBJ_PI) == -1 )
        fprintf( pFile, "  input  clock;\n" );
    // write inputs, outputs, registers, and wires
    if ( Abc_NtkPiNum(pNtk) > 0  )
    {
//        fprintf( pFile, "  input gclk," );
        fprintf( pFile, "  input " );
        Io_WriteVerilogPis( pFile, pNtk, 10 );
        fprintf( pFile, ";\n" );
    }
    if ( Abc_NtkPoNum(pNtk) > 0  )
    {
        fprintf( pFile, "  output" );
        Io_WriteVerilogPos( pFile, pNtk, 5 );
        fprintf( pFile, ";\n" );
    }
    // if this is not a blackbox, write internal signals
    if ( !Abc_NtkHasBlackbox(pNtk) )
    {
        if ( Abc_NtkLatchNum(pNtk) > 0 )
        {
            fprintf( pFile, "  reg" );
            Io_WriteVerilogRegs( pFile, pNtk, 4 );
            fprintf( pFile, ";\n" );
        }
        if ( Io_WriteVerilogWiresCount(pNtk) > 0 )
        {
            fprintf( pFile, "  wire" );
            Io_WriteVerilogWires( pFile, pNtk, 4 );
            fprintf( pFile, ";\n" );
        }
        // write nodes
        Io_WriteVerilogObjects( pFile, pNtk, fOnlyAnds );        
        // write registers
        if ( Abc_NtkLatchNum(pNtk) > 0 )
            Io_WriteVerilogLatches( pFile, pNtk );
    }
    // finalize the file
    fprintf( pFile, "endmodule\n\n" );
}